

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

void sat_solver2_rollback(sat_solver2 *s)

{
  veci *v;
  uint uVar1;
  uint uVar2;
  Vec_Set_t *pVVar3;
  int *piVar4;
  int **ppiVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  sat_solver2_rollback::Count = sat_solver2_rollback::Count + 1;
  if ((s->iVarPivot < 0) || (s->size < s->iVarPivot)) {
    __assert_fail("s->iVarPivot >= 0 && s->iVarPivot <= s->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x638,"void sat_solver2_rollback(sat_solver2 *)");
  }
  iVar8 = s->iTrailPivot;
  lVar11 = (long)iVar8;
  if (-1 < lVar11) {
    uVar1 = s->qtail;
    uVar6 = (ulong)uVar1;
    if (iVar8 <= (int)uVar1) {
      pVVar3 = s->pPrf1;
      if ((pVVar3 != (Vec_Set_t *)0x0) &&
         ((s->hProofPivot < 1 ||
          ((pVVar3->iPage << ((byte)pVVar3->nPageSize & 0x1f)) + (int)*pVVar3->pPages[pVVar3->iPage]
           < s->hProofPivot)))) {
        __assert_fail("s->pPrf1 == NULL || (s->hProofPivot >= 1 && s->hProofPivot <= Vec_SetHandCurrent(s->pPrf1))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x63a,"void sat_solver2_rollback(sat_solver2 *)");
      }
      if ((s->trail_lim).size != 0) {
        __assert_fail("solver2_dlevel(s) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x209,"void solver2_canceluntil_rollback(sat_solver2 *, int)");
      }
      if (uVar1 != s->qhead) {
        __assert_fail("s->qtail == s->qhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x20a,"void solver2_canceluntil_rollback(sat_solver2 *, int)");
      }
      for (; lVar11 < (long)uVar6; uVar6 = uVar6 - 1) {
        iVar9 = s->trail[uVar6 - 1] >> 1;
        s->assigns[iVar9] = '\x03';
        s->reasons[iVar9] = 0;
        s->units[iVar9] = 0;
      }
      for (lVar12 = (long)s->qhead; lVar11 < lVar12; lVar12 = lVar12 + -1) {
        order_unassigned(s,s->trail[lVar12 + -1] >> 1);
      }
      s->qtail = iVar8;
      s->qhead = iVar8;
      uVar1 = s->iVarPivot;
      uVar6 = (ulong)uVar1;
      if ((int)uVar1 < s->size) {
        if (s->activity2 != (uint *)0x0) {
          s->var_inc = s->var_inc2;
          memcpy(s->activity,s->activity2,(long)(int)uVar1 << 2);
        }
        veci_resize(&s->order,0);
        for (lVar11 = 0; uVar6 = (ulong)s->iVarPivot, lVar11 < (long)uVar6; lVar11 = lVar11 + 1) {
          if (s->assigns[lVar11] == '\x03') {
            s->orderpos[lVar11] = (s->order).size;
            veci_push(&s->order,(int)lVar11);
            order_update(s,(int)lVar11);
          }
        }
      }
      lVar11 = 0;
      while( true ) {
        iVar8 = (int)uVar6 * 2;
        lVar12 = (long)iVar8;
        if (lVar12 <= lVar11) break;
        v = s->wlists + lVar11;
        piVar4 = s->wlists[lVar11].ptr;
        iVar8 = 0;
        for (lVar12 = 0; lVar12 < v->size; lVar12 = lVar12 + 1) {
          uVar1 = piVar4[lVar12];
          if ((int)uVar1 < (s->Mem).BookMarkH[((s->Mem).uLearnedMask & uVar1) != 0]) {
            lVar10 = (long)iVar8;
            iVar8 = iVar8 + 1;
            piVar4[lVar10] = uVar1;
          }
        }
        veci_resize(v,iVar8);
        lVar11 = lVar11 + 1;
        uVar6 = (ulong)(uint)s->iVarPivot;
      }
      iVar9 = s->size;
      uVar6 = (long)iVar8 << 4 | 4;
      for (; SBORROW8(lVar12,(long)iVar9 * 2) != lVar12 + (long)iVar9 * -2 < 0; lVar12 = lVar12 + 1)
      {
        *(undefined4 *)((long)&s->wlists->cap + uVar6) = 0;
        uVar6 = uVar6 + 0x10;
      }
      uVar1 = (s->Mem).BookMarkE[0];
      (s->stats).clauses = uVar1;
      uVar2 = (s->Mem).BookMarkE[1];
      (s->stats).learnts = uVar2;
      (s->Mem).nEntries[0] = uVar1;
      (s->Mem).nEntries[1] = uVar2;
      bVar7 = (byte)(s->Mem).nPageSize;
      uVar1 = (s->Mem).BookMarkH[0];
      iVar8 = (s->Mem).BookMarkH[1];
      iVar9 = (int)uVar1 >> (bVar7 & 0x1f);
      (s->Mem).iPage[0] = iVar9;
      (s->Mem).iPage[1] = iVar8 >> (bVar7 & 0x1f);
      ppiVar5 = (s->Mem).pPages;
      *ppiVar5[iVar9] = uVar1 & (s->Mem).uPageMask;
      *ppiVar5[(s->Mem).iPage[1]] = (s->Mem).uPageMask & (s->Mem).BookMarkH[1];
      veci_resize(&s->act_clas,(s->stats).learnts);
      if (s->pPrf1 != (Vec_Set_t *)0x0) {
        veci_resize(&s->claProofs,(s->stats).learnts);
        pVVar3 = s->pPrf1;
        bVar7 = (byte)pVVar3->nPageSize;
        uVar1 = s->hProofPivot;
        if ((pVVar3->iPage << (bVar7 & 0x1f)) + (int)*pVVar3->pPages[pVVar3->iPage] < (int)uVar1) {
          __assert_fail("h <= Vec_SetHandCurrent(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecSet.h"
                        ,0x111,"void Vec_SetShrink(Vec_Set_t *, int)");
        }
        iVar8 = (int)uVar1 >> (bVar7 & 0x1f);
        pVVar3->iPage = iVar8;
        *pVVar3->pPages[iVar8] = (long)(int)(pVVar3->uPageMask & uVar1);
      }
      if (s->pPrf2 == (Prf_Man_t *)0x0) {
        s->size = s->iVarPivot;
        if (s->iVarPivot == 0) {
          s->qhead = 0;
          s->qtail = 0;
          s->cla_inc = 0x800;
          s->root_level = 0;
          s->random_seed = 91648253.0;
          s->progress_estimate = 0.0;
          s->verbosity = 0;
          s->var_inc = 0x20;
          (s->stats).starts = 0;
          (s->stats).clauses = 0;
          (s->stats).learnts = 0;
          (s->stats).decisions = 0;
          (s->stats).propagations = 0;
          (s->stats).inspects = 0;
          (s->stats).conflicts = 0;
          (s->stats).tot_literals = 0;
          (s->stats).clauses_literals = 0;
          (s->stats).learnts_literals = 0;
          s->hLearntLast = -1;
          s->hProofLast = -1;
          s->iTrailPivot = 0;
          s->hProofPivot = 1;
        }
        return;
      }
      __assert_fail("s->pPrf2 == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                    ,0x66c,"void sat_solver2_rollback(sat_solver2 *)");
    }
  }
  __assert_fail("s->iTrailPivot >= 0 && s->iTrailPivot <= s->qtail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                ,0x639,"void sat_solver2_rollback(sat_solver2 *)");
}

Assistant:

void sat_solver2_rollback( sat_solver2* s )
{
    Sat_Mem_t * pMem = &s->Mem;
    int i, k, j;
    static int Count = 0;
    Count++;
    assert( s->iVarPivot >= 0 && s->iVarPivot <= s->size );
    assert( s->iTrailPivot >= 0 && s->iTrailPivot <= s->qtail );
    assert( s->pPrf1 == NULL || (s->hProofPivot >= 1 && s->hProofPivot <= Vec_SetHandCurrent(s->pPrf1)) );
    // reset implication queue
    solver2_canceluntil_rollback( s, s->iTrailPivot );
    // update order 
    if ( s->iVarPivot < s->size )
    { 
        if ( s->activity2 )
        {
            s->var_inc = s->var_inc2;
            memcpy( s->activity, s->activity2, sizeof(unsigned) * s->iVarPivot );
        }
        veci_resize(&s->order, 0);
        for ( i = 0; i < s->iVarPivot; i++ )
        {
            if ( var_value(s, i) != varX )
                continue;
            s->orderpos[i] = veci_size(&s->order);
            veci_push(&s->order,i);
            order_update(s, i);
        }
    }
    // compact watches
    for ( i = 0; i < s->iVarPivot*2; i++ )
    {
        cla* pArray = veci_begin(&s->wlists[i]);
        for ( j = k = 0; k < veci_size(&s->wlists[i]); k++ )
            if ( Sat_MemClauseUsed(pMem, pArray[k]) )
                pArray[j++] = pArray[k];
        veci_resize(&s->wlists[i],j);
    }
    // reset watcher lists
    for ( i = 2*s->iVarPivot; i < 2*s->size; i++ )
        s->wlists[i].size = 0;

    // reset clause counts
    s->stats.clauses = pMem->BookMarkE[0];
    s->stats.learnts = pMem->BookMarkE[1];
    // rollback clauses
    Sat_MemRollBack( pMem );

    // resize learned arrays
    veci_resize(&s->act_clas,  s->stats.learnts);
    if ( s->pPrf1 ) 
    {
        veci_resize(&s->claProofs, s->stats.learnts);
        Vec_SetShrink(s->pPrf1, s->hProofPivot); 
        // some weird bug here, which shows only on 64-bits!
        // temporarily, perform more general proof reduction
//        Sat_ProofReduce( s->pPrf1, &s->claProofs, s->hProofPivot );
    }
    assert( s->pPrf2 == NULL );
//    if ( s->pPrf2 )
//        Prf_ManShrink( s->pPrf2, s->stats.learnts );

    // initialize other vars
    s->size = s->iVarPivot;
    if ( s->size == 0 )
    {
    //    s->size                   = 0;
    //    s->cap                    = 0;
        s->qhead                  = 0;
        s->qtail                  = 0;
#ifdef USE_FLOAT_ACTIVITY2
        s->var_inc                = 1;
        s->cla_inc                = 1;
        s->var_decay              = (float)(1 / 0.95  );
        s->cla_decay              = (float)(1 / 0.999 );
#else
        s->var_inc                = (1 <<  5);
        s->cla_inc                = (1 << 11);
#endif
        s->root_level             = 0;
        s->random_seed            = 91648253;
        s->progress_estimate      = 0;
        s->verbosity              = 0;

        s->stats.starts           = 0;
        s->stats.decisions        = 0;
        s->stats.propagations     = 0;
        s->stats.inspects         = 0;
        s->stats.conflicts        = 0;
        s->stats.clauses          = 0;
        s->stats.clauses_literals = 0;
        s->stats.learnts          = 0;
        s->stats.learnts_literals = 0;
        s->stats.tot_literals     = 0;
        // initialize clause pointers
        s->hLearntLast            = -1; // the last learnt clause 
        s->hProofLast             = -1; // the last proof ID

        // initialize rollback
        s->iVarPivot              =  0; // the pivot for variables
        s->iTrailPivot            =  0; // the pivot for trail
        s->hProofPivot            =  1; // the pivot for proof records
    }
}